

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_driver.cc
# Opt level: O2

void test_38(QPDF *pdf,char *arg2)

{
  int iVar1;
  ostream *poVar2;
  int iVar3;
  QPDFObjectHandle qtest;
  allocator<char> local_71;
  undefined1 local_70 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_68;
  string local_60 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_58;
  string local_50 [32];
  
  QPDF::getRoot();
  std::__cxx11::string::string<std::allocator<char>>(local_50,"/QTest",&local_71);
  QPDFObjectHandle::getKey(local_60);
  std::__cxx11::string::~string(local_50);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_68);
  iVar3 = 0;
  while( true ) {
    iVar1 = QPDFObjectHandle::getArrayNItems();
    if (iVar1 <= iVar3) break;
    QPDFObjectHandle::getArrayItem((int)local_70);
    QPDFObjectHandle::unparseResolved_abi_cxx11_();
    poVar2 = std::operator<<((ostream *)&std::cout,local_50);
    std::endl<char,std::char_traits<char>>(poVar2);
    std::__cxx11::string::~string(local_50);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_68);
    iVar3 = iVar3 + 1;
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_58);
  return;
}

Assistant:

static void
test_38(QPDF& pdf, char const* arg2)
{
    // Designed for override-compressed-object.pdf
    QPDFObjectHandle qtest = pdf.getRoot().getKey("/QTest");
    for (int i = 0; i < qtest.getArrayNItems(); ++i) {
        std::cout << qtest.getArrayItem(i).unparseResolved() << std::endl;
    }
}